

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

void __thiscall QTreeWidgetItem::setFirstColumnSpanned(QTreeWidgetItem *this,bool span)

{
  QTreeView *this_00;
  undefined4 row;
  QTreeModel *__s;
  long in_FS_OFFSET;
  QModelIndex local_60;
  undefined1 local_48 [16];
  QTreeWidgetItem *local_38;
  Data *local_28;
  
  local_28 = *(Data **)(in_FS_OFFSET + 0x28);
  __s = treeModel(this,(QTreeWidget *)0x0);
  if ((__s != (QTreeModel *)0x0) && (__s->headerItem != this)) {
    local_38 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTreeModel::index((QTreeModel *)local_48,(char *)__s,(int)this);
    this_00 = &this->view->super_QTreeView;
    row = local_48._0_4_;
    if (local_38 == (QTreeWidgetItem *)0x0) {
      local_60.r = -1;
      local_60.c = -1;
      local_60.i = 0;
      local_60.m.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      (*local_38->_vptr_QTreeWidgetItem[0xd])(&local_60,local_38,local_48);
    }
    QTreeView::setFirstColumnSpanned(this_00,row,&local_60,span);
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItem::setFirstColumnSpanned(bool span)
{
    const QTreeModel *model = treeModel();
    if (!model || this == model->headerItem)
        return; // We can't set the header items to spanning
    const QModelIndex index = model->index(this, 0);
    view->setFirstColumnSpanned(index.row(), index.parent(), span);
}